

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cc
# Opt level: O2

void __thiscall
xLearn::PARSER_TEST_Parse_libsvm_no_y_Test::PARSER_TEST_Parse_libsvm_no_y_Test
          (PARSER_TEST_Parse_libsvm_no_y_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00153dd0;
  return;
}

Assistant:

TEST(PARSER_TEST, Parse_libsvm_no_y) {
  write_data(Kfilename, kStrNoy);
  char* buffer = nullptr;
  uint64 size = ReadFileToMemory(Kfilename, &buffer);
  DMatrix matrix;
  LibsvmParser parser;
  parser.setLabel(false);
  parser.setSplitor(" ");
  parser.Parse(buffer, size, matrix, true);
  check(matrix, false, false);
  parser.Parse(buffer, size, matrix, false);
  check_double(matrix, false, false);
  parser.Parse(buffer, size, matrix, true);
  check(matrix, false, false);
  RemoveFile(Kfilename.c_str());
}